

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int is_uppercase(char *str)

{
  size_t sVar1;
  ushort **ppuVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar4 = 0;
  if ((*str != '\0') && (sVar1 = strlen(str), uVar4 = 0, sVar1 != 0)) {
    ppuVar2 = __ctype_b_loc();
    sVar3 = 0;
    uVar4 = 0;
    do {
      if (((*ppuVar2)[str[sVar3]] >> 9 & 1) != 0) {
        return 0;
      }
      if (uVar4 == 0) {
        uVar4 = (*ppuVar2)[str[sVar3]] >> 8 & 1;
      }
      else {
        uVar4 = 1;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return uVar4;
}

Assistant:

static int is_uppercase(const char * str)
{
   size_t c;
   int hasupper = 0;

   if( !str || !*str ) return 0;

   for(c = 0; c < strlen(str); c++ ) {
     if( islower((int) str[c]) ) return 0;
     if( !hasupper && isupper((int) str[c]) ) hasupper = 1;
   }

   return hasupper;
}